

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O0

void __thiscall Moc::prependNamespaces(Moc *this,BaseDef *def,QList<NamespaceDef> *namespaceList)

{
  long lVar1;
  bool bVar2;
  reference def_00;
  QList<NamespaceDef> *in_RDX;
  long in_RSI;
  Moc *in_RDI;
  long in_FS_OFFSET;
  const_reverse_iterator rend;
  const_reverse_iterator it;
  QStringBuilder<const_QByteArray_&,_const_char_(&)[3]> *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QList<NamespaceDef>::crbegin(in_RDX);
  QList<NamespaceDef>::crend(in_RDX);
  while (bVar2 = std::operator!=((reverse_iterator<QList<NamespaceDef>::const_iterator> *)in_RDI,
                                 (reverse_iterator<QList<NamespaceDef>::const_iterator> *)
                                 in_stack_ffffffffffffff98), bVar2) {
    def_00 = std::reverse_iterator<QList<NamespaceDef>::const_iterator>::operator*
                       ((reverse_iterator<QList<NamespaceDef>::const_iterator> *)in_RDI);
    bVar2 = inNamespace(in_RDI,def_00);
    if (bVar2) {
      in_stack_ffffffffffffff98 =
           (QStringBuilder<const_QByteArray_&,_const_char_(&)[3]> *)(in_RSI + 0x18);
      std::reverse_iterator<QList<NamespaceDef>::const_iterator>::operator->
                ((reverse_iterator<QList<NamespaceDef>::const_iterator> *)in_stack_ffffffffffffff98)
      ;
      ::operator+((QByteArray *)in_RDI,(char (*) [3])in_stack_ffffffffffffff98);
      ::QStringBuilder::operator_cast_to_QByteArray(in_stack_ffffffffffffff98);
      QByteArray::prepend((QByteArray *)in_stack_ffffffffffffff98);
      QByteArray::~QByteArray((QByteArray *)0x131bf1);
    }
    std::reverse_iterator<QList<NamespaceDef>::const_iterator>::operator++
              ((reverse_iterator<QList<NamespaceDef>::const_iterator> *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Moc::prependNamespaces(BaseDef &def, const QList<NamespaceDef> &namespaceList) const
{
    auto it = namespaceList.crbegin();
    const auto rend = namespaceList.crend();
    for (; it != rend; ++it) {
        if (inNamespace(&*it))
            def.qualified.prepend(it->classname + "::");
    }
}